

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int like_at_loc(int for_match,char *file,int line,char *got,char *expected,char *fmt,...)

{
  char in_AL;
  int __errcode;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint local_25c;
  undefined1 local_258 [48];
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  char local_1a8 [8];
  char errbuf [256];
  undefined1 local_98 [4];
  int err;
  va_list args;
  regex_t re;
  int test;
  char *fmt_local;
  char *expected_local;
  char *got_local;
  int line_local;
  char *file_local;
  int for_match_local;
  
  if (in_AL != '\0') {
    local_228 = in_XMM0_Qa;
    local_218 = in_XMM1_Qa;
    local_208 = in_XMM2_Qa;
    local_1f8 = in_XMM3_Qa;
    local_1e8 = in_XMM4_Qa;
    local_1d8 = in_XMM5_Qa;
    local_1c8 = in_XMM6_Qa;
    local_1b8 = in_XMM7_Qa;
  }
  __errcode = regcomp((regex_t *)&args[0].reg_save_area,expected,1);
  if (__errcode == 0) {
    local_25c = regexec((regex_t *)&args[0].reg_save_area,got,0,(regmatch_t *)0x0,0);
    regfree((regex_t *)&args[0].reg_save_area);
    if (for_match != 0) {
      local_25c = (uint)((local_25c != 0 ^ 0xffU) & 1);
    }
    args[0].overflow_arg_area = local_258;
    args[0]._0_8_ = &stack0x00000008;
    err = 0x30;
    local_98 = (undefined1  [4])0x30;
    vok_at_loc(file,line,local_25c,fmt,(__va_list_tag *)local_98);
    if (local_25c == 0) {
      if (for_match == 0) {
        diag("                   \'%s\'",got);
        diag("          matches: \'%s\'",expected);
      }
      else {
        diag("                   \'%s\'",got);
        diag("    doesn\'t match: \'%s\'",expected);
      }
    }
    return local_25c;
  }
  regerror(__errcode,(regex_t *)&args[0].reg_save_area,local_1a8,0x100);
  fprintf(_stderr,"Unable to compile regex \'%s\': %s at %s line %d\n",expected,local_1a8,file,
          (ulong)(uint)line);
  exit(0xff);
}

Assistant:

int
like_at_loc (int for_match, const char *file, int line, const char *got,
             const char *expected, const char *fmt, ...)
{
    int test;
    regex_t re;
    va_list args;
    int err = regcomp(&re, expected, REG_EXTENDED);
    if (err) {
        char errbuf[256];
        regerror(err, &re, errbuf, sizeof errbuf);
        fprintf(stderr, "Unable to compile regex '%s': %s at %s line %d\n",
                        expected, errbuf, file, line);
        exit(255);
    }
    err = regexec(&re, got, 0, NULL, 0);
    regfree(&re);
    test = for_match ? !err : err;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        if (for_match) {
            diag("                   '%s'", got);
            diag("    doesn't match: '%s'", expected);
        }
        else {
            diag("                   '%s'", got);
            diag("          matches: '%s'", expected);
        }
    }
    return test;
}